

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall
kws::Parser::IsBetweenSingleQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  string stream;
  char *local_40;
  long local_38;
  
  std::__cxx11::string::string((string *)&local_40,(string *)buffer);
  if (1 < pos + 1) {
    if (buffer->_M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_40);
      if (withComments) {
        std::__cxx11::string::_M_assign((string *)&local_40);
      }
    }
    if (((pos != 1) || (*local_40 == '\'')) && (local_38 - 1U != pos)) {
      if ((local_40[pos - 1] == '\'') ||
         ((local_40[pos - 1] == '\\' && (local_40[pos - 2] == '\'')))) {
        bVar1 = local_40[pos + 1] == '\'';
        goto LAB_0011d958;
      }
    }
  }
  bVar1 = false;
LAB_0011d958:
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool Parser::IsBetweenSingleQuote(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;

  if(pos == std::string::npos)
    {
    return false;
    }

  if(pos == 0)
    {
    return false;
    }

    if (buffer.empty()) {
      stream = m_BufferNoComment;
      if (withComments) {
        stream = m_Buffer;
      }
    }

  if(pos == 1 && stream[0] != '\'')
    {
    return false;
    }

  if(pos == stream.length()-1)
    {
    return false;
    }

  return ( ( stream[pos-1] == '\'' || ( stream[pos-1] == '\\' &&
       stream[pos-2] == '\'' ) ) && stream[pos+1] == '\'' );
}